

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrlp_util.cc
# Opt level: O0

CtrlPMatchMode cpsm::parse_ctrlp_match_mode(string_ref mmode)

{
  basic_string_ref<char,_std::char_traits<char>_> x;
  basic_string_ref<char,_std::char_traits<char>_> x_00;
  basic_string_ref<char,_std::char_traits<char>_> x_01;
  basic_string_ref<char,_std::char_traits<char>_> x_02;
  basic_string_ref<char,_std::char_traits<char>_> args_1;
  bool bVar1;
  undefined8 uVar2;
  Error *in_RSI;
  char *in_RDI;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  char *pcVar3;
  Error *pEVar4;
  basic_string_ref<char,_std::char_traits<char>_> local_18;
  
  local_18.ptr_ = in_RDI;
  local_18.len_ = (size_t)in_RSI;
  bVar1 = boost::basic_string_ref<char,_std::char_traits<char>_>::empty(&local_18);
  if ((bVar1) ||
     (x.len_ = in_stack_ffffffffffffffa0, x.ptr_ = in_stack_ffffffffffffff98,
     bVar1 = boost::operator==(x,in_stack_ffffffffffffff90), bVar1)) {
    return FULL_LINE;
  }
  x_00.len_ = in_stack_ffffffffffffffa0;
  x_00.ptr_ = in_stack_ffffffffffffff98;
  bVar1 = boost::operator==(x_00,in_stack_ffffffffffffff90);
  if (bVar1) {
    return FILENAME_ONLY;
  }
  x_01.len_ = in_stack_ffffffffffffffa0;
  x_01.ptr_ = in_stack_ffffffffffffff98;
  pcVar3 = local_18.ptr_;
  pEVar4 = (Error *)local_18.len_;
  bVar1 = boost::operator==(x_01,in_stack_ffffffffffffff90);
  if (!bVar1) {
    x_02.len_ = in_stack_ffffffffffffffa0;
    x_02.ptr_ = in_stack_ffffffffffffff98;
    bVar1 = boost::operator==(x_02,in_stack_ffffffffffffff90);
    if (bVar1) {
      return UNTIL_LAST_TAB;
    }
    uVar2 = __cxa_allocate_exception(0x28);
    args_1.len_ = (size_t)pEVar4;
    args_1.ptr_ = pcVar3;
    Error::Error<char_const*,boost::basic_string_ref<char,std::char_traits<char>>>
              ((Error *)local_18.len_,local_18.ptr_,args_1);
    __cxa_throw(uVar2,&Error::typeinfo,Error::~Error);
  }
  return FIRST_NON_TAB;
}

Assistant:

CtrlPMatchMode parse_ctrlp_match_mode(boost::string_ref const mmode) {
  if (mmode.empty() || mmode == "full-line") {
    return CtrlPMatchMode::FULL_LINE;
  } else if (mmode == "filename-only") {
    return CtrlPMatchMode::FILENAME_ONLY;
  } else if (mmode == "first-non-tab") {
    return CtrlPMatchMode::FIRST_NON_TAB;
  } else if (mmode == "until-last-tab") {
    return CtrlPMatchMode::UNTIL_LAST_TAB;
  }
  throw Error("unknown match mode ", mmode);
}